

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O3

void new_localvar(LexState *ls,TString *name,int n)

{
  int iVar1;
  FuncState *fs;
  GCObject *o;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  GCObject *pGVar4;
  unsigned_short uVar5;
  long lVar6;
  long lVar7;
  undefined8 *puVar8;
  ulong uVar9;
  FuncState *pFVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  fs = ls->fs;
  pFVar10 = fs;
  if (199 < (int)((uint)fs->nactvar + n)) {
    errorlimit(fs,200,"local variables");
    pFVar10 = ls->fs;
  }
  o = (GCObject *)pFVar10->f;
  iVar1 = (o->p).sizelocvars;
  if (pFVar10->nlocvars < iVar1) {
    pGVar4 = (o->h).gclist;
  }
  else {
    pGVar4 = (GCObject *)
             luaM_growaux_(ls->L,(o->h).gclist,&(o->p).sizelocvars,0x10,0x7fff,
                           "too many local variables");
    (o->h).gclist = pGVar4;
    auVar3 = _DAT_0011d290;
    auVar2 = _DAT_0011d280;
    if (iVar1 < (o->p).sizelocvars) {
      lVar6 = (long)(o->p).sizelocvars - (long)iVar1;
      lVar7 = lVar6 + -1;
      auVar11._8_4_ = (int)lVar7;
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
      puVar8 = (undefined8 *)((long)pGVar4 + (long)iVar1 * 0x10 + 0x10);
      uVar9 = 0;
      auVar11 = auVar11 ^ _DAT_0011d290;
      do {
        auVar12._8_4_ = (int)uVar9;
        auVar12._0_8_ = uVar9;
        auVar12._12_4_ = (int)(uVar9 >> 0x20);
        auVar12 = (auVar12 | auVar2) ^ auVar3;
        if ((bool)(~(auVar12._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar12._0_4_ ||
                    auVar11._4_4_ < auVar12._4_4_) & 1)) {
          puVar8[-2] = 0;
        }
        if ((auVar12._12_4_ != auVar11._12_4_ || auVar12._8_4_ <= auVar11._8_4_) &&
            auVar12._12_4_ <= auVar11._12_4_) {
          *puVar8 = 0;
        }
        uVar9 = uVar9 + 2;
        puVar8 = puVar8 + 4;
      } while ((lVar6 + 1U & 0xfffffffffffffffe) != uVar9);
    }
  }
  uVar5 = pFVar10->nlocvars;
  *(TString **)((long)pGVar4 + (long)(short)uVar5 * 0x10) = name;
  if ((((name->tsv).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
    luaC_barrierf(ls->L,o,(GCObject *)name);
    uVar5 = pFVar10->nlocvars;
  }
  pFVar10->nlocvars = uVar5 + 1;
  fs->actvar[(long)n + (ulong)fs->nactvar] = uVar5;
  return;
}

Assistant:

static void new_localvar (LexState *ls, TString *name, int n) {
  FuncState *fs = ls->fs;
  luaY_checklimit(fs, fs->nactvar+n+1, LUAI_MAXVARS, "local variables");
  fs->actvar[fs->nactvar+n] = cast(unsigned short, registerlocalvar(ls, name));
}